

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O2

CURLcode Curl_auth_create_ntlm_type3_message
                   (Curl_easy *data,char *userp,char *passwdp,ntlmdata *ntlm,bufref *out)

{
  ulong uVar1;
  ntlmdata *pnVar2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Curl_easy *pCVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  size_t sVar15;
  uint uVar16;
  ulong domlen;
  uint uVar17;
  uint ntresplen;
  size_t local_928;
  size_t local_920;
  Curl_easy *local_918;
  undefined8 local_910;
  undefined8 local_908;
  char *local_900;
  char *local_8f8;
  uchar *ntlmv2resp;
  uint local_8e8;
  uint local_8e4;
  uint local_8e0;
  uint local_8dc;
  long local_8d8;
  uchar *local_8d0;
  ntlmdata *local_8c8;
  ulong local_8c0;
  size_t local_8b8;
  size_t local_8b0;
  ulong local_8a8;
  ulong local_8a0;
  uchar lmbuffer [24];
  uchar ntresp [24];
  uchar lmresp [24];
  uchar ntlmbuf [1024];
  char host [1025];
  
  ntresplen = 0x18;
  ntlmv2resp = (uchar *)0x0;
  uVar16 = ntlm->flags;
  local_918 = data;
  memset(host,0,0x401);
  pcVar5 = strchr(userp,0x5c);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = strchr(userp,0x2f);
  }
  domlen = (long)pcVar5 - (long)userp;
  local_8f8 = pcVar5 + 1;
  if (pcVar5 == (char *)0x0) {
    local_8f8 = userp;
  }
  local_900 = userp;
  if (pcVar5 == (char *)0x0) {
    domlen = 0;
    local_900 = "";
  }
  local_920 = strlen(local_8f8);
  iVar3 = Curl_gethostname(host,0x401);
  pCVar10 = local_918;
  if (iVar3 == 0) {
    local_928 = strlen(host);
    pCVar10 = local_918;
  }
  else {
    local_928 = 0;
    Curl_infof(local_918,"gethostname() failed, continuing without!");
  }
  if ((ntlm->flags & 0x80000) == 0) {
    local_908 = (ulong)uVar16;
    CVar4 = Curl_ntlm_core_mk_nt_hash(pCVar10,passwdp,ntlmbuf);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    local_910 = out;
    Curl_ntlm_core_lm_resp(ntlmbuf,ntlm->nonce,ntresp);
    CVar4 = Curl_ntlm_core_mk_lm_hash(pCVar10,passwdp,lmbuffer);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    local_8d0 = ntresp;
    Curl_ntlm_core_lm_resp(lmbuffer,ntlm->nonce,lmresp);
    uVar12 = ntlm->flags & 0xfff7ffff;
    ntlm->flags = uVar12;
    uVar16 = (uint)local_908;
    out = local_910;
    sVar15 = local_920;
    uVar8 = 0x18;
  }
  else {
    CVar4 = Curl_rand(pCVar10,lmbuffer,8);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_nt_hash(pCVar10,passwdp,ntlmbuf);
    sVar15 = local_920;
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_ntlmv2_hash(local_8f8,local_920,local_900,domlen,ntlmbuf,ntresp);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_lmv2_resp(ntresp,lmbuffer,ntlm->nonce,lmresp);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_ntlmv2_resp(ntresp,lmbuffer,ntlm,&ntlmv2resp,&ntresplen);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    local_8d0 = ntlmv2resp;
    uVar12 = ntlm->flags;
    uVar8 = ntresplen;
  }
  uVar16 = uVar16 & 1;
  local_8b8 = sVar15 * 2;
  local_8d8 = local_928 << (sbyte)uVar16;
  local_8b0 = local_8b8;
  if (uVar16 == 0) {
    local_8b0 = sVar15;
  }
  local_8c0 = domlen * 2;
  local_8a8 = local_8c0;
  if (uVar16 == 0) {
    local_8a8 = domlen;
  }
  uVar7 = (uint)local_8a8;
  uVar13 = uVar7 + uVar8 + 0x58;
  uVar9 = uVar8 >> 8 & 0xff;
  local_910 = (bufref *)(CONCAT44(local_910._4_4_,uVar7) & 0xffffffff000000ff);
  local_908 = CONCAT44(local_908._4_4_,uVar7 >> 8) & 0xffffffff000000ff;
  local_8e8 = uVar8 + 0x58 & 0xff;
  local_8e4 = (uint)local_8b0 & 0xff;
  uVar14 = (uint)(local_8b0 >> 8) & 0xff;
  local_8dc = uVar13 & 0xff;
  uVar11 = (uint)local_8b0 + uVar13;
  uVar7 = uVar13 >> 8 & 0xff;
  local_8a0 = (ulong)uVar7;
  uVar13 = (uint)local_8d8 & 0xff;
  uVar17 = (uint)((ulong)local_8d8 >> 8) & 0xff;
  local_8e0 = uVar11 & 0xff;
  local_8c8 = ntlm;
  uVar12 = curl_msnprintf((char *)ntlmbuf,0x400,
                          "NTLMSSP%c\x03%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c"
                          ,0,0,0,0,0x18,0,0x18,0,0x40,0,0,0,uVar8 & 0xff,uVar9,uVar8 & 0xff,uVar9,
                          0x58,0,0,0,(undefined4)local_910,(undefined4)local_908,
                          (undefined4)local_910,(undefined4)local_908,local_8e8,
                          uVar8 + 0x58 >> 8 & 0xff,0,0,local_8e4,uVar14,local_8e4,uVar14,local_8dc,
                          uVar7,0,0,uVar13,uVar17,uVar13,uVar17,local_8e0,uVar11 >> 8 & 0xff,0,0,0,0
                          ,0,0,0,0,0,0,uVar12 & 0xff,uVar12 >> 8 & 0xff,uVar12 >> 0x10 & 0xff,
                          uVar12 >> 0x18);
  pnVar2 = local_8c8;
  pCVar10 = local_918;
  lVar6 = (long)(int)uVar12;
  if (uVar12 < 1000) {
    *(undefined8 *)(ntlmbuf + lVar6 + 0x10) = lmresp._16_8_;
    *(undefined8 *)(ntlmbuf + lVar6) = lmresp._0_8_;
    *(undefined8 *)(ntlmbuf + lVar6 + 8) = lmresp._8_8_;
    lVar6 = lVar6 + 0x18;
  }
  uVar1 = lVar6 + (ulong)ntresplen;
  if (uVar1 < 0x401) {
    memcpy(ntlmbuf + lVar6,local_8d0,(ulong)ntresplen);
    (*Curl_cfree)(ntlmv2resp);
    if (local_8a8 + local_8b0 + local_8d8 + uVar1 < 0x400) {
      if (uVar16 == 0) {
        memcpy(ntlmbuf + uVar1,local_900,domlen);
        sVar15 = local_920;
        memcpy(ntlmbuf + uVar1 + domlen,local_8f8,local_920);
        lVar6 = uVar1 + domlen + sVar15;
        memcpy(ntlmbuf + lVar6,host,local_928);
      }
      else {
        unicodecpy(ntlmbuf + uVar1,local_900,domlen & 0x7fffffffffffffff);
        lVar6 = uVar1 + local_8c0;
        unicodecpy(ntlmbuf + lVar6,local_8f8,local_920 & 0x7fffffffffffffff);
        lVar6 = lVar6 + local_8b8;
        unicodecpy(ntlmbuf + lVar6,host,local_928 & 0x7fffffffffffffff);
      }
      CVar4 = Curl_bufref_memdup(out,ntlmbuf,lVar6 + local_8d8);
      (*Curl_cfree)(pnVar2->target_info);
      pnVar2->target_info = (void *)0x0;
      pnVar2->target_info_len = 0;
      return CVar4;
    }
    pcVar5 = "user + domain + host name too big";
  }
  else {
    pcVar5 = "incoming NTLM message too big";
  }
  Curl_failf(pCVar10,pcVar5);
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_auth_create_ntlm_type3_message(struct Curl_easy *data,
                                             const char *userp,
                                             const char *passwdp,
                                             struct ntlmdata *ntlm,
                                             struct bufref *out)
{
  /* NTLM type-3 message structure:

          Index  Description            Content
            0    NTLMSSP Signature      Null-terminated ASCII "NTLMSSP"
                                        (0x4e544c4d53535000)
            8    NTLM Message Type      long (0x03000000)
           12    LM/LMv2 Response       security buffer
           20    NTLM/NTLMv2 Response   security buffer
           28    Target Name            security buffer
           36    User Name              security buffer
           44    Workstation Name       security buffer
          (52)   Session Key            security buffer (*)
          (60)   Flags                  long (*)
          (64)   OS Version Structure   8 bytes (*)
  52 (64) (72)   Start of data block
                                          (*) -> Optional
  */

  CURLcode result = CURLE_OK;
  size_t size;
  unsigned char ntlmbuf[NTLM_BUFSIZE];
  int lmrespoff;
  unsigned char lmresp[24]; /* fixed-size */
#ifdef USE_NTRESPONSES
  int ntrespoff;
  unsigned int ntresplen = 24;
  unsigned char ntresp[24]; /* fixed-size */
  unsigned char *ptr_ntresp = &ntresp[0];
  unsigned char *ntlmv2resp = NULL;
#endif
  bool unicode = (ntlm->flags & NTLMFLAG_NEGOTIATE_UNICODE) ? TRUE : FALSE;
  char host[HOSTNAME_MAX + 1] = "";
  const char *user;
  const char *domain = "";
  size_t hostoff = 0;
  size_t useroff = 0;
  size_t domoff = 0;
  size_t hostlen = 0;
  size_t userlen = 0;
  size_t domlen = 0;

  user = strchr(userp, '\\');
  if(!user)
    user = strchr(userp, '/');

  if(user) {
    domain = userp;
    domlen = (user - domain);
    user++;
  }
  else
    user = userp;

  userlen = strlen(user);

  /* Get the machine's un-qualified host name as NTLM doesn't like the fully
     qualified domain name */
  if(Curl_gethostname(host, sizeof(host))) {
    infof(data, "gethostname() failed, continuing without!");
    hostlen = 0;
  }
  else {
    hostlen = strlen(host);
  }

#if defined(USE_NTRESPONSES) && \
    (defined(USE_NTLM2SESSION) || defined(USE_NTLM_V2))
  /* We don't support NTLM2 or extended security if we don't have
     USE_NTRESPONSES */
  if(ntlm->flags & NTLMFLAG_NEGOTIATE_NTLM2_KEY) {
# if defined(USE_NTLM_V2)
    unsigned char ntbuffer[0x18];
    unsigned char entropy[8];
    unsigned char ntlmv2hash[0x18];

    /* Full NTLM version 2
       Although this cannot be negotiated, it is used here if available, as
       servers featuring extended security are likely supporting also
       NTLMv2. */
    result = Curl_rand(data, entropy, 8);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_ntlmv2_hash(user, userlen, domain, domlen,
                                           ntbuffer, ntlmv2hash);
    if(result)
      return result;

    /* LMv2 response */
    result = Curl_ntlm_core_mk_lmv2_resp(ntlmv2hash, entropy,
                                         &ntlm->nonce[0], lmresp);
    if(result)
      return result;

    /* NTLMv2 response */
    result = Curl_ntlm_core_mk_ntlmv2_resp(ntlmv2hash, entropy,
                                           ntlm, &ntlmv2resp, &ntresplen);
    if(result)
      return result;

    ptr_ntresp = ntlmv2resp;
# else /* defined(USE_NTLM_V2) */
    unsigned char ntbuffer[0x18];
    unsigned char tmp[0x18];
    unsigned char md5sum[MD5_DIGEST_LEN];
    unsigned char entropy[8];

    /* NTLM version 1 with extended security. */

    /* Need to create 8 bytes random data */
    result = Curl_rand(data, entropy, 8);
    if(result)
      return result;

    /* 8 bytes random data as challenge in lmresp */
    memcpy(lmresp, entropy, 8);

    /* Pad with zeros */
    memset(lmresp + 8, 0, 0x10);

    /* Fill tmp with challenge(nonce?) + entropy */
    memcpy(tmp, &ntlm->nonce[0], 8);
    memcpy(tmp + 8, entropy, 8);

    Curl_md5it(md5sum, tmp, 16);

    /* We shall only use the first 8 bytes of md5sum, but the des code in
       Curl_ntlm_core_lm_resp only encrypt the first 8 bytes */
    result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(ntbuffer, md5sum, ntresp);

    /* End of NTLM2 Session code */
    /* NTLM v2 session security is a misnomer because it is not NTLM v2.
       It is NTLM v1 using the extended session security that is also
       in NTLM v2 */
# endif /* defined(USE_NTLM_V2) */
  }
  else
#endif
  {

#ifdef USE_NTRESPONSES
    unsigned char ntbuffer[0x18];
#endif
    unsigned char lmbuffer[0x18];

    /* NTLM version 1 */

#ifdef USE_NTRESPONSES
    result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], ntresp);
#endif

    result = Curl_ntlm_core_mk_lm_hash(data, passwdp, lmbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(lmbuffer, &ntlm->nonce[0], lmresp);
    ntlm->flags &= ~NTLMFLAG_NEGOTIATE_NTLM2_KEY;

    /* A safer but less compatible alternative is:
     *   Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], lmresp);
     * See https://davenport.sourceforge.io/ntlm.html#ntlmVersion2 */
  }

  if(unicode) {
    domlen = domlen * 2;
    userlen = userlen * 2;
    hostlen = hostlen * 2;
  }

  lmrespoff = 64; /* size of the message header */
#ifdef USE_NTRESPONSES
  ntrespoff = lmrespoff + 0x18;
  domoff = ntrespoff + ntresplen;
#else
  domoff = lmrespoff + 0x18;
#endif
  useroff = domoff + domlen;
  hostoff = useroff + userlen;

  /* Create the big type-3 message binary blob */
  size = msnprintf((char *)ntlmbuf, NTLM_BUFSIZE,
                   NTLMSSP_SIGNATURE "%c"
                   "\x03%c%c%c"  /* 32-bit type = 3 */

                   "%c%c"  /* LanManager length */
                   "%c%c"  /* LanManager allocated space */
                   "%c%c"  /* LanManager offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* NT-response length */
                   "%c%c"  /* NT-response allocated space */
                   "%c%c"  /* NT-response offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* domain length */
                   "%c%c"  /* domain allocated space */
                   "%c%c"  /* domain name offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* user length */
                   "%c%c"  /* user allocated space */
                   "%c%c"  /* user offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* host length */
                   "%c%c"  /* host allocated space */
                   "%c%c"  /* host offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* session key length (unknown purpose) */
                   "%c%c"  /* session key allocated space (unknown purpose) */
                   "%c%c"  /* session key offset (unknown purpose) */
                   "%c%c"  /* 2 zeroes */

                   "%c%c%c%c",  /* flags */

                   /* domain string */
                   /* user string */
                   /* host string */
                   /* LanManager response */
                   /* NT response */

                   0,                /* zero termination */
                   0, 0, 0,          /* type-3 long, the 24 upper bits */

                   SHORTPAIR(0x18),  /* LanManager response length, twice */
                   SHORTPAIR(0x18),
                   SHORTPAIR(lmrespoff),
                   0x0, 0x0,

#ifdef USE_NTRESPONSES
                   SHORTPAIR(ntresplen),  /* NT-response length, twice */
                   SHORTPAIR(ntresplen),
                   SHORTPAIR(ntrespoff),
                   0x0, 0x0,
#else
                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,
#endif
                   SHORTPAIR(domlen),
                   SHORTPAIR(domlen),
                   SHORTPAIR(domoff),
                   0x0, 0x0,

                   SHORTPAIR(userlen),
                   SHORTPAIR(userlen),
                   SHORTPAIR(useroff),
                   0x0, 0x0,

                   SHORTPAIR(hostlen),
                   SHORTPAIR(hostlen),
                   SHORTPAIR(hostoff),
                   0x0, 0x0,

                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,

                   LONGQUARTET(ntlm->flags));

  DEBUGASSERT(size == 64);
  DEBUGASSERT(size == (size_t)lmrespoff);

  /* We append the binary hashes */
  if(size < (NTLM_BUFSIZE - 0x18)) {
    memcpy(&ntlmbuf[size], lmresp, 0x18);
    size += 0x18;
  }

  DEBUG_OUT({
    fprintf(stderr, "**** TYPE3 header lmresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[lmrespoff], 0x18);
  });

#ifdef USE_NTRESPONSES
  /* ntresplen + size should not be risking an integer overflow here */
  if(ntresplen + size > sizeof(ntlmbuf)) {
    failf(data, "incoming NTLM message too big");
    return CURLE_OUT_OF_MEMORY;
  }
  DEBUGASSERT(size == (size_t)ntrespoff);
  memcpy(&ntlmbuf[size], ptr_ntresp, ntresplen);
  size += ntresplen;

  DEBUG_OUT({
    fprintf(stderr, "\n   ntresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[ntrespoff], ntresplen);
  });

  free(ntlmv2resp);/* Free the dynamic buffer allocated for NTLMv2 */

#endif

  DEBUG_OUT({
    fprintf(stderr, "\n   flags=0x%02.2x%02.2x%02.2x%02.2x 0x%08.8x ",
            LONGQUARTET(ntlm->flags), ntlm->flags);
    ntlm_print_flags(stderr, ntlm->flags);
    fprintf(stderr, "\n****\n");
  });

  /* Make sure that the domain, user and host strings fit in the
     buffer before we copy them there. */
  if(size + userlen + domlen + hostlen >= NTLM_BUFSIZE) {
    failf(data, "user + domain + host name too big");
    return CURLE_OUT_OF_MEMORY;
  }

  DEBUGASSERT(size == domoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], domain, domlen / 2);
  else
    memcpy(&ntlmbuf[size], domain, domlen);

  size += domlen;

  DEBUGASSERT(size == useroff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], user, userlen / 2);
  else
    memcpy(&ntlmbuf[size], user, userlen);

  size += userlen;

  DEBUGASSERT(size == hostoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], host, hostlen / 2);
  else
    memcpy(&ntlmbuf[size], host, hostlen);

  size += hostlen;

  /* Convert domain, user, and host to ASCII but leave the rest as-is */
  result = Curl_convert_to_network(data, (char *)&ntlmbuf[domoff],
                                   size - domoff);
  if(result)
    return CURLE_CONV_FAILED;

  /* Return the binary blob. */
  result = Curl_bufref_memdup(out, ntlmbuf, size);

  Curl_auth_cleanup_ntlm(ntlm);

  return result;
}